

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-capability.c++
# Opt level: O1

Promise<void> __thiscall
capnp::Request<capnp::DynamicStruct,_capnp::DynamicStruct>::sendStreaming
          (Request<capnp::DynamicStruct,_capnp::DynamicStruct> *this)

{
  long *plVar1;
  long in_RSI;
  DebugExpression<bool> _kjCondition;
  Fault f;
  DebugExpression<bool> local_19;
  Fault local_18;
  
  local_19.value = StructSchema::isStreamResult((StructSchema *)(in_RSI + 0x40));
  if (local_19.value) {
    (**(code **)(**(long **)(in_RSI + 0x38) + 8))(this);
    plVar1 = *(long **)(in_RSI + 0x38);
    if (plVar1 != (long *)0x0) {
      *(undefined8 *)(in_RSI + 0x38) = 0;
      (**(code **)**(undefined8 **)(in_RSI + 0x30))
                (*(undefined8 **)(in_RSI + 0x30),(long)plVar1 + *(long *)(*plVar1 + -0x10));
    }
    return (PromiseBase)(PromiseBase)this;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
            (&local_18,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-capability.c++"
             ,0x67,FAILED,"resultSchema.isStreamResult()","_kjCondition,",&local_19);
  kj::_::Debug::Fault::fatal(&local_18);
}

Assistant:

kj::Promise<void> Request<DynamicStruct, DynamicStruct>::sendStreaming() {
  KJ_REQUIRE(resultSchema.isStreamResult());

  auto promise = hook->sendStreaming();
  hook = nullptr;  // prevent reuse
  return promise;
}